

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_19::MuteWuninitialized(Printer *p)

{
  basic_string_view<char,_std::char_traits<char>_> local_20;
  Printer *local_10;
  Printer *p_local;
  
  local_10 = p;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n    #if defined(__llvm__)\n    #pragma clang diagnostic push\n    #pragma clang diagnostic ignored \"-Wuninitialized\"\n    #endif  // __llvm__\n  "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(p,local_20._M_len,local_20._M_str);
  return;
}

Assistant:

void MuteWuninitialized(io::Printer* p) {
  p->Emit(R"(
    #if defined(__llvm__)
    #pragma clang diagnostic push
    #pragma clang diagnostic ignored "-Wuninitialized"
    #endif  // __llvm__
  )");
}